

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O0

int read_numeral(LexState *ls,SemInfo *seminfo)

{
  byte *pbVar1;
  int iVar2;
  size_t sVar3;
  uint local_48;
  uint local_44;
  uint local_40;
  char *pcStack_38;
  int first;
  char *expo;
  TValue obj;
  SemInfo *seminfo_local;
  LexState *ls_local;
  
  pcStack_38 = "Ee";
  iVar2 = ls->current;
  obj._8_8_ = seminfo;
  save(ls,ls->current);
  sVar3 = ls->z->n;
  ls->z->n = sVar3 - 1;
  if (sVar3 == 0) {
    local_40 = luaZ_fill(ls->z);
  }
  else {
    pbVar1 = (byte *)ls->z->p;
    ls->z->p = (char *)(pbVar1 + 1);
    local_40 = (uint)*pbVar1;
  }
  ls->current = local_40;
  if ((iVar2 == 0x30) && (iVar2 = check_next2(ls,"xX"), iVar2 != 0)) {
    pcStack_38 = "Pp";
  }
  while( true ) {
    while (iVar2 = check_next2(ls,pcStack_38), iVar2 != 0) {
      check_next2(ls,"-+");
    }
    if (((""[ls->current + 1] & 0x10) == 0) && (ls->current != 0x2e)) break;
    save(ls,ls->current);
    sVar3 = ls->z->n;
    ls->z->n = sVar3 - 1;
    if (sVar3 == 0) {
      local_44 = luaZ_fill(ls->z);
    }
    else {
      pbVar1 = (byte *)ls->z->p;
      ls->z->p = (char *)(pbVar1 + 1);
      local_44 = (uint)*pbVar1;
    }
    ls->current = local_44;
  }
  if ((""[ls->current + 1] & 1) != 0) {
    save(ls,ls->current);
    sVar3 = ls->z->n;
    ls->z->n = sVar3 - 1;
    if (sVar3 == 0) {
      local_48 = luaZ_fill(ls->z);
    }
    else {
      pbVar1 = (byte *)ls->z->p;
      ls->z->p = (char *)(pbVar1 + 1);
      local_48 = (uint)*pbVar1;
    }
    ls->current = local_48;
  }
  save(ls,0);
  sVar3 = luaO_str2num(ls->buff->buffer,(TValue *)&expo);
  if (sVar3 != 0) {
    if (obj.value_.ub == '\x03') {
      *(char **)obj._8_8_ = expo;
      ls_local._4_4_ = 0x122;
    }
    else {
      *(char **)obj._8_8_ = expo;
      ls_local._4_4_ = 0x121;
    }
    return ls_local._4_4_;
  }
  lexerror(ls,"malformed number",0x121);
}

Assistant:

static int read_numeral (LexState *ls, SemInfo *seminfo) {
  TValue obj;
  const char *expo = "Ee";
  int first = ls->current;
  lua_assert(lisdigit(ls->current));
  save_and_next(ls);
  if (first == '0' && check_next2(ls, "xX"))  /* hexadecimal? */
    expo = "Pp";
  for (;;) {
    if (check_next2(ls, expo))  /* exponent mark? */
      check_next2(ls, "-+");  /* optional exponent sign */
    else if (lisxdigit(ls->current) || ls->current == '.')  /* '%x|%.' */
      save_and_next(ls);
    else break;
  }
  if (lislalpha(ls->current))  /* is numeral touching a letter? */
    save_and_next(ls);  /* force an error */
  save(ls, '\0');
  if (luaO_str2num(luaZ_buffer(ls->buff), &obj) == 0)  /* format error? */
    lexerror(ls, "malformed number", TK_FLT);
  if (ttisinteger(&obj)) {
    seminfo->i = ivalue(&obj);
    return TK_INT;
  }
  else {
    lua_assert(ttisfloat(&obj));
    seminfo->r = fltvalue(&obj);
    return TK_FLT;
  }
}